

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>,unsigned_int>
               (Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
                *col,set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *setcont,vector<bool,_std::allocator<bool>_> *veccont)

{
  uint uVar1;
  _Rb_tree_const_iterator<unsigned_int> __first1;
  undefined8 uVar2;
  Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
  *pSVar3;
  bool bVar4;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  _Bit_type *p_Var7;
  const_iterator cVar8;
  ulong uVar9;
  uint uVar10;
  _Bit_const_iterator __first1_00;
  _Bit_const_iterator __last1;
  _Bit_const_iterator __first2;
  vector<bool,_std::allocator<bool>_> container;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_238;
  Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
  *local_208;
  undefined **local_200;
  ulong local_1f8;
  shared_count sStack_1f0;
  size_t **local_1e8;
  _Rb_tree_node_base local_1e0;
  Column_support *local_1c0;
  char *local_1b8;
  char *local_1b0;
  shared_count sStack_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  size_t local_140;
  size_t local_138;
  size_t *local_130;
  size_t *local_128;
  _Base_ptr local_120;
  _Base_ptr local_118;
  _Base_ptr local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x11d);
  get_column_content_via_iterators<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>>
            ((column_content<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>
              *)&local_238,col);
  if (local_238._M_impl.super__Rb_tree_header._M_node_count ==
      (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    __first1._M_node._4_4_ = local_238._M_impl.super__Rb_tree_header._M_header._M_left._4_4_;
    __first1._M_node._0_4_ = (uint)local_238._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar4 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<unsigned_int>,std::_Rb_tree_const_iterator<unsigned_int>>
                      (__first1,(_Rb_tree_const_iterator<unsigned_int>)
                                &local_238._M_impl.super__Rb_tree_header,
                       (setcont->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar4 = false;
  }
  local_1e0._M_color._0_1_ = bVar4;
  local_1e0._M_parent = (_Base_ptr)0x0;
  local_1e0._M_left = (_Base_ptr)0x0;
  local_1b8 = "get_column_content_via_iterators(col) == setcont";
  local_1b0 = "";
  local_1f8 = local_1f8 & 0xffffffffffffff00;
  local_200 = &PTR__lazy_ostream_0022e388;
  sStack_1f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_1e8 = (size_t **)&local_1b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&local_1e0._M_left);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_238);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x11e);
  uVar10 = (*(int *)&(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
           *(int *)&(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
           (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  local_208 = col;
  if ((int)uVar10 < 0) {
    if ((col->column_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      local_238._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_238._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
      local_238._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ = 0;
      local_238._M_impl._0_8_ = (_Bit_type *)0x0;
      local_238._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
      local_238._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      goto LAB_001232c5;
    }
    lVar5 = std::_Rb_tree_decrement(&(col->column_)._M_t._M_impl.super__Rb_tree_header._M_header);
    uVar10 = *(int *)(*(long *)(lVar5 + 0x20) + 4) + 1;
  }
  local_200 = (undefined **)((ulong)local_200 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_238,(long)(int)uVar10,(bool *)&local_200,
             (allocator_type *)&local_1b8);
  uVar2 = local_238._M_impl._0_8_;
  p_Var6 = (col->column_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (((_Rb_tree_header *)p_Var6 != &(col->column_)._M_t._M_impl.super__Rb_tree_header &&
         (uVar1 = *(uint *)(*(long *)(p_Var6 + 1) + 4), uVar1 < uVar10))) {
    *(ulong *)(uVar2 + (ulong)(uVar1 >> 6) * 8) =
         *(ulong *)(uVar2 + (ulong)(uVar1 >> 6) * 8) | 1L << ((byte)uVar1 & 0x3f);
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  }
LAB_001232c5:
  __last1.super__Bit_iterator_base._M_offset =
       (uint)local_238._M_impl.super__Rb_tree_header._M_header._M_left;
  __last1.super__Bit_iterator_base._M_p =
       (_Bit_type *)local_238._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  if ((ulong)(uint)local_238._M_impl.super__Rb_tree_header._M_header._M_left +
      ((long)local_238._M_impl.super__Rb_tree_header._M_header._M_parent - local_238._M_impl._0_8_)
      * 8 == (ulong)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
             ((long)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var7)
             * 8) {
    __first1_00.super__Bit_iterator_base._8_8_ = 0;
    __first1_00.super__Bit_iterator_base._M_p = (_Bit_type *)local_238._M_impl._0_8_;
    __last1.super__Bit_iterator_base._12_4_ = 0;
    __first2.super__Bit_iterator_base._8_8_ = 0;
    __first2.super__Bit_iterator_base._M_p = p_Var7;
    bVar4 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_00,__last1,__first2);
  }
  else {
    bVar4 = false;
  }
  pSVar3 = local_208;
  local_1e0._M_color._0_1_ = bVar4;
  local_1e0._M_parent = (_Base_ptr)0x0;
  local_1e0._M_left = (_Base_ptr)0x0;
  local_1b8 = "col.get_content(veccont.size()) == veccont";
  local_1b0 = "";
  local_1f8 = local_1f8 & 0xffffffffffffff00;
  local_200 = &PTR__lazy_ostream_0022e388;
  sStack_1f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_1e8 = (size_t **)&local_1b8;
  boost::test_tools::tt_detail::report_assertion(&local_1e0,&local_200,&local_a0,0x11e,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&local_1e0._M_left);
  if ((_Bit_type *)local_238._M_impl._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_238._M_impl._0_8_,
                    (long)local_238._M_impl.super__Rb_tree_header._M_header._M_right -
                    local_238._M_impl._0_8_);
    local_238._M_impl._0_8_ = (_Bit_type *)0x0;
    local_238._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_238._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    local_238._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_238._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
    local_238._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  }
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x120);
  local_1e0._M_parent = (_Base_ptr)((ulong)local_1e0._M_parent & 0xffffffffffffff00);
  local_1e0._0_8_ = &PTR__lazy_ostream_0022e440;
  local_1e0._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1e0._M_right = (_Base_ptr)0x1ec196;
  local_138 = (pSVar3->column_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_128 = &local_138;
  local_140 = (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_1b8 = (char *)CONCAT71(local_1b8._1_7_,local_138 == local_140);
  local_130 = &local_140;
  local_1b0 = (char *)0x0;
  sStack_1a8.pi_ = (sp_counted_base *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_238._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_128;
  local_238._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_238._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  local_238._M_impl._0_8_ = &PTR__lazy_ostream_0022e400;
  local_238._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_130;
  local_1f8 = local_1f8 & 0xffffffffffffff00;
  local_200 = &PTR__lazy_ostream_0022e400;
  sStack_1f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1a8);
  if (((veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p ==
       (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p) &&
     ((veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset == 0)) {
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_c8 = "";
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x124);
    local_200 = (undefined **)
                CONCAT71(local_200._1_7_,
                         (pSVar3->column_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0);
    local_1f8 = 0;
    sStack_1f0.pi_ = (sp_counted_base *)0x0;
    local_1e0._0_8_ = "col.is_empty()";
    local_1e0._M_parent = (_Base_ptr)0x1ecd9d;
    local_238._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_238._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
    local_238._M_impl._0_8_ = &PTR__lazy_ostream_0022e388;
    local_238._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_238._M_impl.super__Rb_tree_header._M_header._M_left = &local_1e0;
    local_f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_e8 = "";
    boost::test_tools::tt_detail::report_assertion();
  }
  else {
    local_100 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_f8 = "";
    local_110 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
    local_108 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x126);
    local_200 = (undefined **)
                CONCAT71(local_200._1_7_,
                         (pSVar3->column_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0);
    local_1f8 = 0;
    sStack_1f0.pi_ = (sp_counted_base *)0x0;
    local_1e0._0_8_ = "!col.is_empty()";
    local_1e0._M_parent = (_Base_ptr)0x1ecd9d;
    local_238._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_238._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
    local_238._M_impl._0_8_ = &PTR__lazy_ostream_0022e388;
    local_238._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_238._M_impl.super__Rb_tree_header._M_header._M_left = &local_1e0;
    local_120 = (_Base_ptr)0x1ecca4;
    local_118 = (_Base_ptr)0x1ecd17;
    boost::test_tools::tt_detail::report_assertion();
  }
  boost::detail::shared_count::~shared_count(&sStack_1f0);
  p_Var7 = (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  if (((long)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p - (long)p_Var7) * 8 +
      (ulong)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset != 0) {
    local_1c0 = &local_208->column_;
    local_208 = (Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
                 *)&(local_208->column_)._M_t._M_impl.super__Rb_tree_header;
    uVar10 = 1;
    uVar9 = 0;
    do {
      if ((p_Var7[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) {
        local_150 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_148 = "";
        local_160 = &boost::unit_test::basic_cstring<char_const>::null;
        local_158 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x12a,
                   &local_160);
        local_238._M_impl._4_4_ = uVar10 - 1;
        local_238._M_impl._0_4_ = 0xffffffff;
        local_1e0._0_8_ = &local_238;
        cVar8 = std::
                _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*>_>
                ::find(&local_1c0->_M_t,(key_type *)&local_1e0);
        local_200 = (undefined **)
                    CONCAT71(local_200._1_7_,
                             (Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
                              *)cVar8._M_node == local_208);
        local_1f8 = 0;
        sStack_1f0.pi_ = (sp_counted_base *)0x0;
        local_1e0._0_8_ = "!col.is_non_zero(i)";
        local_1e0._M_parent = (_Base_ptr)0x1ecdb1;
        local_238._M_impl.super__Rb_tree_header._M_header._0_8_ =
             local_238._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
        local_238._M_impl._0_8_ = &PTR__lazy_ostream_0022e388;
        local_238._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_170 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_168 = "";
        local_238._M_impl.super__Rb_tree_header._M_header._M_left = &local_1e0;
        boost::test_tools::tt_detail::report_assertion(&local_200,&local_238,&local_170,0x12a,1,0,0)
        ;
      }
      else {
        local_180 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_178 = "";
        local_190 = &boost::unit_test::basic_cstring<char_const>::null;
        local_188 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,300,&local_190)
        ;
        local_238._M_impl._4_4_ = uVar10 - 1;
        local_238._M_impl._0_4_ = 0xffffffff;
        local_1e0._0_8_ = &local_238;
        cVar8 = std::
                _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*>_>
                ::find(&local_1c0->_M_t,(key_type *)&local_1e0);
        local_200 = (undefined **)
                    CONCAT71(local_200._1_7_,
                             (Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
                              *)cVar8._M_node != local_208);
        local_1f8 = 0;
        sStack_1f0.pi_ = (sp_counted_base *)0x0;
        local_1e0._0_8_ = "col.is_non_zero(i)";
        local_1e0._M_parent = (_Base_ptr)0x1ecdb1;
        local_238._M_impl.super__Rb_tree_header._M_header._0_8_ =
             local_238._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
        local_238._M_impl._0_8_ = &PTR__lazy_ostream_0022e388;
        local_238._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_1a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_198 = "";
        local_238._M_impl.super__Rb_tree_header._M_header._M_left = &local_1e0;
        boost::test_tools::tt_detail::report_assertion(&local_200,&local_238,&local_1a0,300,1,0,0);
      }
      boost::detail::shared_count::~shared_count(&sStack_1f0);
      uVar9 = (ulong)uVar10;
      p_Var7 = (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar10 = uVar10 + 1;
    } while (uVar9 < (ulong)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     ((long)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)p_Var7) * 8);
  }
  return;
}

Assistant:

void column_test_common_content_access(Column& col,
                                       const std::set<entry_type>& setcont,
                                       const std::vector<typename Column::Field_element>& veccont) {
  BOOST_CHECK(get_column_content_via_iterators(col) == setcont);
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(col.size(), setcont.size());
  }

  if (veccont.empty())
    BOOST_CHECK(col.is_empty());
  else
    BOOST_CHECK(!col.is_empty());

  for (unsigned int i = 0; i < veccont.size(); ++i) {
    if (veccont[i] == 0u)
      BOOST_CHECK(!col.is_non_zero(i));
    else
      BOOST_CHECK(col.is_non_zero(i));
  }
}